

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O2

void prepare_ide(string *base_path,string *problem_no,int file_no)

{
  FILE *pFVar1;
  runtime_error *prVar2;
  int file_no_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string f_no;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  file_no_local = file_no;
  if (file_no == -1) {
    std::operator<<((ostream *)&std::cout,"Which file-set? ");
    std::istream::operator>>((istream *)&std::cin,&file_no_local);
  }
  std::operator+(&local_a0,base_path,"/in_out_exp_files/");
  std::operator+(&local_c0,&local_a0,problem_no);
  std::operator+(&f_no,&local_c0,"/");
  std::__cxx11::string::operator=((string *)&sub_path_abi_cxx11_,(string *)&f_no);
  std::__cxx11::string::~string((string *)&f_no);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::to_string(&f_no,file_no_local);
  std::operator+(&local_80,&sub_path_abi_cxx11_,"in");
  std::operator+(&local_a0,&local_80,&f_no);
  std::operator+(&local_c0,&local_a0,".txt");
  std::__cxx11::string::operator=((string *)&in_name_abi_cxx11_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&sub_path_abi_cxx11_,"out");
  std::operator+(&local_a0,&local_80,&f_no);
  std::operator+(&local_c0,&local_a0,".txt");
  std::__cxx11::string::operator=((string *)&out_name_abi_cxx11_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&sub_path_abi_cxx11_,"exp");
  std::operator+(&local_a0,&local_80,&f_no);
  std::operator+(&local_c0,&local_a0,".txt");
  std::__cxx11::string::operator=((string *)&expected_name_abi_cxx11_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_40,"Reading files for problem ",problem_no);
  std::operator+(&local_80,&local_40,", file-nr ");
  std::operator+(&local_a0,&local_80,&f_no);
  std::operator+(&local_c0,&local_a0,"...");
  write_colored_text(&local_c0,green);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  old_stdout = dup(1);
  pFVar1 = freopen(in_name_abi_cxx11_._M_dataplus._M_p,"r",_stdin);
  if (pFVar1 != (FILE *)0x0) {
    pFVar1 = freopen(out_name_abi_cxx11_._M_dataplus._M_p,"w",_stdout);
    if (pFVar1 != (FILE *)0x0) {
      start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      std::__cxx11::string::~string((string *)&f_no);
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c0,"Problems reading from out-file ",&out_name_abi_cxx11_);
    std::runtime_error::runtime_error(prVar2,(string *)&local_c0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c0,"Problems reading from in-file ",&in_name_abi_cxx11_);
  std::runtime_error::runtime_error(prVar2,(string *)&local_c0);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void prepare_ide(const string &base_path, const string &problem_no, int file_no) {
    if (file_no == -1) {
        cout << "Which file-set? ";
        cin >> file_no;
    }


    sub_path = base_path + "/in_out_exp_files/" + problem_no + "/";
    string f_no = to_string(file_no);
    in_name = sub_path + "in" + f_no + ".txt";
    out_name = sub_path + "out" + f_no + ".txt";
    expected_name = sub_path + "exp" + f_no + ".txt";

    write_colored_text("Reading files for problem " + problem_no + ", file-nr " + f_no + "...", green);

    /*
     * Note: I initially declared the parameter to pass like:
     *            prepare_ide(string problem_no, int file_no) {...}
     * That worked fine,but CLion complained:
     *            "Clang-Tidy: The parameter 'message' is copied for each invocation but only used as a const reference;
     *            consider making it a const reference."
     * With auto-refactoring by CLion, it was changed to a const reference:
     *            prepare_ide(const string &problem_no, int file_no) {...}
     */

    /*
     * For input file:
     * NOTE: this method requires a char* (or char-array) as first parameter.
     * For conversion, use ...c_str()
     * See https://stackoverflow.com/questions/7352099/stdstring-to-char
     *
     * For replacing 'cout', just write 'stdout'
     */

    // First save the old file-descriptors:
    // -> In linux, the following streams are associated:
    //    - 0: stdin
    //    - 1: stdout
    //    - 2: stderr
//    old_stdin = dup(0);
    old_stdout = dup(1);
    if (!freopen(in_name.c_str(), "r", stdin)) {
        throw runtime_error("Problems reading from in-file " + in_name);
    }
    if (!freopen(out_name.c_str(), "w", stdout)) {
        throw runtime_error("Problems reading from out-file " + out_name);
    }

    // Start the code timer:
    start = chrono::high_resolution_clock::now();
}